

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

bool __thiscall SQInstance::InstanceOf(SQInstance *this,SQClass *trg)

{
  do {
    this = (SQInstance *)((SQClass *)this)->_base;
    if ((SQClass *)this == trg) break;
  } while ((SQClass *)this != (SQClass *)0x0);
  return (SQClass *)this != (SQClass *)0x0;
}

Assistant:

bool SQInstance::InstanceOf(SQClass *trg)
{
    SQClass *parent = _class;
    while(parent != NULL) {
        if(parent == trg)
            return true;
        parent = parent->_base;
    }
    return false;
}